

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test6::initTest(GPUShaderFP64Test6 *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  GLenum err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  Functions *gl;
  GPUShaderFP64Test6 *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_compute_shader");
  if (bVar1) {
    bVar1 = Utils::isGLVersionAtLeast(gl_00,4,2);
    if (bVar1) {
      GVar3 = (*gl_00->createShader)(0x91b9);
      this->m_cs_id = GVar3;
    }
  }
  GVar3 = (*gl_00->createShader)(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (*gl_00->createShader)(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (*gl_00->createShader)(0x8e88);
  this->m_tc_id = GVar3;
  GVar3 = (*gl_00->createShader)(0x8e87);
  this->m_te_id = GVar3;
  GVar3 = (*gl_00->createShader)(0x8b31);
  this->m_vs_id = GVar3;
  err = (*gl_00->getError)();
  glu::checkError(err,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2212);
  return;
}

Assistant:

void GPUShaderFP64Test6::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate shader objects */

	/* Compute shader support and GL 4.2 required */
	if ((true == m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader")) &&
		(true == Utils::isGLVersionAtLeast(gl, 4 /* major */, 2 /* minor */)))
	{
		m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	}

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
}